

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tokenizer-0.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  istream *piVar6;
  pointer pcVar7;
  int *piVar8;
  mapped_type *this;
  ostream *poVar9;
  undefined8 extraout_RAX;
  long lVar10;
  long lVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  char *pcVar14;
  undefined8 *puVar15;
  int *tok;
  _Alloc_hider _Var16;
  pointer unaff_R13;
  ulong uVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  byte bVar20;
  bool success;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_type __dnew;
  string sraw;
  llama_context *ctx;
  string fname_inp;
  vector<int,_std::allocator<int>_> toks;
  string fname_text;
  string fname_out;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sinp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sout;
  string stok;
  llama_tests k_tests;
  llama_context_params cparams;
  llama_model_params mparams;
  undefined8 auStack_688 [16];
  byte local_601;
  pointer local_600;
  ulong local_5f8;
  int local_5ec;
  value_type local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  llama_context *local_588;
  long *local_580 [2];
  long local_570 [2];
  uint local_560;
  int local_55c;
  vector<int,_std::allocator<int>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  long *local_520 [2];
  long local_510 [2];
  long local_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  uint auStack_428 [50];
  undefined8 auStack_360 [37];
  string local_238;
  byte abStack_218 [32];
  undefined1 local_1f8;
  
  bVar20 = 0;
  if (argc < 2) {
    main_cold_9();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,argv[1],(allocator<char> *)&local_448);
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_580,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append((char *)local_580);
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_520,local_4f8,local_4f0 + (long)local_4f8);
  std::__cxx11::string::append((char *)local_520);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  if (argc != 2) {
    pcVar14 = argv[2];
    strlen(pcVar14);
    std::__cxx11::string::_M_replace((ulong)&local_540,0,(char *)0x0,(ulong)pcVar14);
  }
  fprintf(_stderr,"%s : reading vocab from: \'%s\'\n","main",local_4f8);
  llama_backend_init();
  llama_model_default_params(&local_238);
  plVar2 = local_4f8;
  local_1f8 = 1;
  psVar12 = &local_238;
  puVar15 = auStack_688;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar15 = (psVar12->_M_dataplus)._M_p;
    psVar12 = (string *)((long)psVar12 + ((ulong)bVar20 * -2 + 1) * 8);
    puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
  }
  lVar10 = llama_model_load_from_file(plVar2);
  if (lVar10 == 0) {
    main_cold_1();
    local_5ec = 1;
  }
  else {
    llama_context_default_params(&local_448);
    pbVar13 = &local_448;
    puVar15 = auStack_688;
    for (lVar11 = 0xf; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pbVar13->_M_dataplus)._M_p;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)pbVar13 + ((ulong)bVar20 * -2 + 1) * 8);
      puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
    }
    local_588 = (llama_context *)llama_init_from_model(lVar10);
    local_5ec = 0;
    if (local_588 == (llama_context *)0x0) {
      fprintf(_stderr,"%s: error: failed to load vocab \'%s\'\n","main",local_4f8);
      llama_model_free(lVar10);
      local_5ec = 1;
    }
  }
  if (local_5ec != 0) goto LAB_00116b10;
  local_601 = 1;
  local_478._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_478._M_impl.super__Rb_tree_header._M_header;
  local_500 = lVar10;
  local_478._M_impl.super__Rb_tree_header._M_header._M_right =
       local_478._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_540._M_string_length == 0) {
    local_478._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_478._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::ifstream::ifstream(&local_448,(string *)local_580,_S_in);
    if ((*(byte *)((long)auStack_428 + *(long *)(local_448._M_dataplus._M_p + -0x18)) & 5) == 0) {
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_5a8,
                 *(undefined8 *)((long)auStack_360 + *(long *)(local_448._M_dataplus._M_p + -0x18)),
                 0xffffffff,0);
      std::ifstream::ifstream(&local_238,(string *)local_520,_S_in);
      if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
        local_5e8._M_string_length = 0;
        local_5e8.field_2._M_allocated_capacity =
             local_5e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        while( true ) {
          cVar3 = std::ios::widen((char)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) +
                                  (char)&local_238);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_238,(string *)&local_5e8,cVar3);
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4b8,&local_5e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
        local_5c8._M_dataplus._M_p = (pointer)0x15;
        local_5e8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_5e8,(ulong)&local_5c8);
        local_5e8.field_2._M_allocated_capacity = (size_type)local_5c8._M_dataplus._M_p;
        builtin_strncpy(local_5e8._M_dataplus._M_p,"\n__ggml_vocab_test__\n",0x15);
        local_5e8._M_string_length = (size_type)local_5c8._M_dataplus._M_p;
        local_5e8._M_dataplus._M_p[(long)local_5c8._M_dataplus._M_p] = '\0';
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        unaff_R13 = (pointer)0x0;
        do {
          if (local_5a8._M_string_length <= unaff_R13) break;
          lVar10 = std::__cxx11::string::find
                             ((char *)&local_5a8,(ulong)local_5e8._M_dataplus._M_p,(ulong)unaff_R13)
          ;
          if (lVar10 == -1) {
            std::__cxx11::string::substr((ulong)&local_5c8,(ulong)&local_5a8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4d8,&local_5c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
              operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            std::__cxx11::string::substr((ulong)&local_5c8,(ulong)&local_5a8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4d8,&local_5c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
              operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1
                             );
            }
            unaff_R13 = (pointer)(local_5e8._M_string_length + lVar10);
          }
        } while (lVar10 != -1);
        if ((long)local_4d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_4d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
            (long)local_4b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_4b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          if (local_4d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_4d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar17 = 0;
            do {
              local_600 = local_4d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_5f8 = uVar17;
              string_strip(&local_5c8,
                           local_4b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar17);
              local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (int *)0x0;
              local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (int *)0x0;
              if ((pointer)local_5c8._M_string_length != (pointer)0x0) {
                do {
                  pcVar7 = (pointer)std::__cxx11::string::find((char)&local_5c8,0x20);
                  if (pcVar7 == (pointer)0xffffffffffffffff) {
                    pcVar7 = (pointer)local_5c8._M_string_length;
                  }
                  std::__cxx11::string::substr((ulong)local_4a0,(ulong)&local_5c8);
                  plVar2 = local_4a0[0];
                  piVar8 = __errno_location();
                  iVar1 = *piVar8;
                  *piVar8 = 0;
                  lVar10 = strtol((char *)plVar2,(char **)&local_480,10);
                  if (local_480 == plVar2) {
                    std::__throw_invalid_argument("stoi");
LAB_00116fd0:
                    std::__throw_out_of_range("stoi");
                    goto LAB_00116fdc;
                  }
                  iVar4 = (int)lVar10;
                  if ((iVar4 != lVar10) || (*piVar8 == 0x22)) goto LAB_00116fd0;
                  if (*piVar8 == 0) {
                    *piVar8 = iVar1;
                  }
                  local_55c = iVar4;
                  if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&local_558,
                               (iterator)
                               local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_55c);
                  }
                  else {
                    *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar4;
                    local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  if (local_4a0[0] != local_490) {
                    operator_delete(local_4a0[0],local_490[0] + 1);
                  }
                  unaff_R13 = pcVar7 + 1;
                } while (unaff_R13 < local_5c8._M_string_length);
              }
              this = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)&local_478,local_600 + uVar17);
              std::vector<int,_std::allocator<int>_>::operator=(this,&local_558);
              if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_558.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_558.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
                operator_delete(local_5c8._M_dataplus._M_p,
                                local_5c8.field_2._M_allocated_capacity + 1);
              }
              uVar17 = local_5f8 + 1;
            } while (uVar17 < (ulong)((long)local_4d8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_4d8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        else {
          main_cold_4();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,
                          (ulong)(local_5e8.field_2._M_allocated_capacity + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4b8);
      }
      else {
        main_cold_3();
      }
      std::ifstream::~ifstream(&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      main_cold_2();
    }
    std::ifstream::~ifstream(&local_448);
    if (local_478._M_impl.super__Rb_tree_header._M_node_count == 0) {
      main_cold_8();
      if (local_600 != (pointer)0x0) {
        operator_delete(local_600,local_5f8 - (long)local_600);
      }
      if (local_238._M_dataplus._M_p != unaff_R13) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_5e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,
                        CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                                 local_540.field_2._M_local_buf[0]) + 1);
      }
      if (local_520[0] != local_510) {
        operator_delete(local_520[0],local_510[0] + 1);
      }
      if (local_580[0] != local_570) {
        operator_delete(local_580[0],local_570[0] + 1);
      }
      if (local_4f8 != local_4e8) {
        operator_delete(local_4f8,local_4e8[0] + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
  }
  else {
    local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_478._M_impl._0_8_ = 0;
    local_478._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
    local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  uVar5 = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_5e8,(long)(int)uVar5,
             (allocator_type *)&local_448);
  local_600 = (pointer)CONCAT44(local_600._4_4_,uVar5);
  if (0 < (int)uVar5) {
    uVar17 = 0;
    do {
      local_238._M_dataplus._M_p = (pointer)0x0;
      local_448._M_dataplus._M_p = (pointer)operator_new(0x28);
      *(undefined ***)local_448._M_dataplus._M_p = &PTR___State_0013b910;
      *(int *)((long)local_448._M_dataplus._M_p + 8) = (int)uVar17;
      *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        **)((long)local_448._M_dataplus._M_p + 0x10) = &local_478;
      *(llama_context ***)((long)local_448._M_dataplus._M_p + 0x18) = &local_588;
      *(byte **)((long)local_448._M_dataplus._M_p + 0x20) = &local_601;
      std::thread::_M_start_thread(&local_238,&local_448,0);
      if ((long *)local_448._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_448._M_dataplus._M_p + 8))();
      }
      if (*(long *)(local_5e8._M_dataplus._M_p + uVar17 * 8) != 0) {
LAB_00116fdc:
        std::terminate();
      }
      *(pointer *)(local_5e8._M_dataplus._M_p + uVar17 * 8) = local_238._M_dataplus._M_p;
      uVar17 = uVar17 + 1;
    } while (uVar5 != uVar17);
  }
  lVar10 = local_500;
  if (0 < (int)local_600) {
    lVar11 = 0;
    do {
      std::thread::join();
      lVar11 = lVar11 + 8;
    } while ((ulong)uVar5 << 3 != lVar11);
  }
  if (local_540._M_string_length == 0) {
LAB_00116a95:
    llama_model_free(lVar10);
    llama_free(local_588);
    llama_backend_free();
    putchar(10);
    pcVar14 = "failed";
    if (local_601 != 0) {
      pcVar14 = "passed";
    }
    printf("Tests %s\n",pcVar14);
    local_5ec = (local_601 ^ 1) * 3;
  }
  else {
    fprintf(_stderr,"%s : tokenizing: \'%s\'\n","main",local_540._M_dataplus._M_p);
    local_238._M_string_length = 0;
    local_238.field_2._M_local_buf[0] = '\0';
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::ifstream::ifstream(&local_448,(string *)&local_540,_S_in);
    uVar5 = *(uint *)((long)auStack_428 + *(long *)(local_448._M_dataplus._M_p + -0x18));
    if ((uVar5 & 5) == 0) {
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_5a8,
                 *(undefined8 *)((long)auStack_360 + *(long *)(local_448._M_dataplus._M_p + -0x18)),
                 0xffffffff,0);
      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      main_cold_5();
      local_5ec = 1;
    }
    std::ifstream::~ifstream(&local_448);
    if ((uVar5 & 5) == 0) {
      fprintf(_stderr,"%s : text size: %zu\n","main");
      lVar10 = ggml_time_us();
      common_tokenize((vector<int,_std::allocator<int>_> *)&local_448,local_588,&local_238,false,
                      false);
      _Var16._M_p = local_448._M_dataplus._M_p;
      lVar11 = ggml_time_us();
      fprintf(_stderr,"%s : tokenized in %.3f ms (cpp)\n",(double)(lVar11 - lVar10) / 1000.0,"main")
      ;
      fprintf(_stderr,"%s : tokens: %zu\n","main",
              (long)(local_448._M_string_length - (long)_Var16._M_p) >> 2);
      std::operator+(&local_5a8,&local_540,".tokcpp");
      std::ofstream::ofstream(&local_448,(string *)&local_5a8,_S_out);
      uVar5 = *(uint *)((long)auStack_428 + *(long *)(local_448._M_dataplus._M_p + -0x18));
      bVar19 = (uVar5 & 5) == 0;
      uVar17 = local_448.field_2._M_allocated_capacity;
      _Var18._M_p = _Var16._M_p;
      if (bVar19) {
        if (_Var16._M_p != (pointer)local_448._M_string_length) {
          local_5f8 = local_448.field_2._M_allocated_capacity;
          local_600 = (pointer)_Var16._M_p;
          local_560 = uVar5;
          do {
            poVar9 = (ostream *)
                     std::ostream::operator<<((ostream *)&local_448,(int)*(long *)_Var16._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            _Var16._M_p = _Var16._M_p + 4;
            uVar17 = local_5f8;
            _Var18._M_p = (pointer)local_600;
            uVar5 = local_560;
          } while (_Var16._M_p != (pointer)local_448._M_string_length);
        }
      }
      else {
        main_cold_6();
        local_5ec = 1;
      }
      std::ofstream::~ofstream(&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if ((uVar5 & 5) == 0) {
        local_600 = (pointer)_Var18._M_p;
        local_5f8 = uVar17;
        std::operator+(&local_448,&local_540,".tokcpp");
        main_cold_7();
        uVar17 = local_5f8;
        _Var18._M_p = (pointer)local_600;
      }
      if ((pointer)_Var18._M_p != (pointer)0x0) {
        operator_delete(_Var18._M_p,uVar17 - (long)_Var18._M_p);
      }
    }
    else {
      bVar19 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    lVar10 = local_500;
    if (bVar19) goto LAB_00116a95;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_5e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_478);
LAB_00116b10:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,
                    CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                             local_540.field_2._M_local_buf[0]) + 1);
  }
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  return local_5ec;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        fprintf(stderr, "Usage: %s vocab-file [text-file]\n", argv[0]);
        return 1;
    }

    const std::string fname = argv[1];

    const std::string fname_inp = fname + ".inp";
    const std::string fname_out = fname + ".out";

    std::string fname_text;
    if (argc > 2) {
        fname_text = argv[2];
    }

    fprintf(stderr, "%s : reading vocab from: '%s'\n", __func__, fname.c_str());

    llama_model * model;
    llama_context * ctx;

    llama_backend_init();

    // load the vocab
    {
        auto mparams = llama_model_default_params();

        mparams.vocab_only = true;

        model = llama_model_load_from_file(fname.c_str(), mparams);

        if (model == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            return 1;
        }

        auto cparams = llama_context_default_params();

        ctx = llama_init_from_model(model, cparams);

        if (ctx == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            llama_model_free(model);
            return 1;
        }
    }

#ifdef _WIN32
    // We need this for unicode console support
    console::init(false, false);
    atexit([]() { console::cleanup(); });
#endif

    bool success = true;

    const auto k_tests = [&]() -> llama_tests {
        if (!fname_text.empty()) {
            return {};
        }

        const auto res = read_tests(fname_inp, fname_out);

        if (res.empty()) {
            fprintf(stderr, "%s : error: no tests found\n", __func__);
            exit(1);
        }

        return res;
    }();

    const bool add_special = false;

    // multi-threaded tokenization
    const int nthread = std::thread::hardware_concurrency();
    std::vector<std::thread> threads(nthread);

    for (int i = 0; i < nthread; i++) {
        threads[i] = std::thread([&, i]() {
            for (const auto & test_kv : k_tests) {
                const std::vector<llama_token> res = common_tokenize(ctx, test_kv.first, add_special, false);

                // here only print the result of the first thread
                // because the other threads are running the same tests
                if (i != 0) {
                    continue;
                }

                printf("\n");
                printf("src: '%s'\n", test_kv.first.c_str());
                printf("res: '%s'\n", common_detokenize(ctx, res).c_str());
                printf("tok: ");
                for (const auto & tok : res) {
                    printf("%d ", tok);
                }
                printf("\n");

                bool correct = res.size() == test_kv.second.size();
                for (int i = 0; i < (int) res.size() && correct; ++i) {
                    if (test_kv.second[i] != res[i]) {
                        correct = false;
                    }
                }

                if (!correct) {
                    fprintf(stderr, "%s : failed test:    '%s'\n", __func__, test_kv.first.c_str());
                    fprintf(stderr, "%s : detokenized to: '%s' instead of '%s'\n", __func__,
                        common_detokenize(ctx, res).c_str(),
                        common_detokenize(ctx, test_kv.second).c_str());
                    fprintf(stderr, "%s : expected tokens: ", __func__);
                    for (const auto & t : test_kv.second) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");
                    fprintf(stderr, "%s : got tokens:      ", __func__);
                    for (const auto & t : res) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");

                    success = false;
                }
            }
        });
    }

    for (int i = 0; i < nthread; i++) {
        threads[i].join();
    }

    // single threaded tokenization
    if (!fname_text.empty()) {
        fprintf(stderr, "%s : tokenizing: '%s'\n", __func__, fname_text.c_str());

        std::string text;
        {
            std::ifstream ifs(fname_text);
            if (!ifs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_text.c_str());
                return 1;
            }
            text = std::string(std::istreambuf_iterator<char>(ifs), std::istreambuf_iterator<char>());
        }

        fprintf(stderr, "%s : text size: %zu\n", __func__, text.size());

        std::vector<llama_token> res;

        {
            const auto t_start = ggml_time_us();

            res = common_tokenize(ctx, text, add_special, false);

            const auto t_end = ggml_time_us();

            fprintf(stderr, "%s : tokenized in %.3f ms (cpp)\n", __func__, (t_end - t_start) / 1000.0);
        }

        fprintf(stderr, "%s : tokens: %zu\n", __func__, res.size());

        {
            const std::string fname_out = fname_text + ".tokcpp";

            std::ofstream ofs(fname_out);
            if (!ofs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_out.c_str());
                return 1;
            }

            for (const auto & tok : res) {
                //ofs << tok << " '" << string_strip(llama_detokenize(ctx, std::vector<int>{tok})) << "'" << std::endl;
                ofs << tok << "\n";
            }
        }

        fprintf(stderr, "%s : tokens written to '%s'\n", __func__, (fname_text + ".tokcpp").c_str());
    }

    llama_model_free(model);
    llama_free(ctx);

    llama_backend_free();

    printf("\n");
    printf("Tests %s\n", success ? "passed" : "failed");

    return success ? 0 : 3;
}